

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

MultiFileOptions *
duckdb::MultiFileOptions::Deserialize
          (MultiFileOptions *__return_storage_ptr__,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  int iVar3;
  
  __return_storage_ptr__->filename = false;
  __return_storage_ptr__->hive_partitioning = false;
  __return_storage_ptr__->auto_detect_hive_partitioning = true;
  __return_storage_ptr__->union_by_name = false;
  __return_storage_ptr__->hive_types_autocast = true;
  __return_storage_ptr__->mapping = BY_NAME;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_buckets =
       &(__return_storage_ptr__->hive_types_schema)._M_h._M_single_bucket;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_element_count = 0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->filename_column)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename_column).field_2;
  (__return_storage_ptr__->filename_column).field_2._M_allocated_capacity = 0x656d616e656c6966;
  (__return_storage_ptr__->filename_column)._M_string_length = 8;
  (__return_storage_ptr__->filename_column).field_2._M_local_buf[8] = '\0';
  (__return_storage_ptr__->custom_options)._M_h._M_buckets =
       &(__return_storage_ptr__->custom_options)._M_h._M_single_bucket;
  (__return_storage_ptr__->custom_options)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->custom_options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->custom_options)._M_h._M_element_count = 0;
  (__return_storage_ptr__->custom_options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->custom_options)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->custom_options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"filename");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->filename = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"hive_partitioning");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->hive_partitioning = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"auto_detect_hive_partitioning");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->auto_detect_hive_partitioning = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"union_by_name");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->union_by_name = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"hive_types_autocast");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->hive_types_autocast = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x69,"hive_types_schema");
  if ((char)uVar2 == '\0') {
    local_88._M_buckets = &local_88._M_single_bucket;
    local_88._M_bucket_count = 1;
    local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_88._M_element_count = 0;
    local_88._M_rehash_policy._M_max_load_factor = 1.0;
    local_88._M_rehash_policy._4_4_ = 0;
    local_88._M_rehash_policy._M_next_resize = 0;
    local_88._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(__return_storage_ptr__->hive_types_schema)._M_h,&local_88);
  }
  else {
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,duckdb::LogicalType,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>>
              ((type *)&local_88,deserializer);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(__return_storage_ptr__->hive_types_schema)._M_h,&local_88);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"filename","");
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6a,"filename_column");
  if ((char)uVar2 == '\0') {
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->filename_column,(string *)local_50);
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_88,deserializer);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->filename_column,(string *)&local_88);
    if ((__node_base *)local_88._M_buckets != &local_88._M_before_begin) {
      operator_delete(local_88._M_buckets);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiFileOptions MultiFileOptions::Deserialize(Deserializer &deserializer) {
	MultiFileOptions result;
	deserializer.ReadPropertyWithDefault<bool>(100, "filename", result.filename);
	deserializer.ReadPropertyWithDefault<bool>(101, "hive_partitioning", result.hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(102, "auto_detect_hive_partitioning", result.auto_detect_hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(103, "union_by_name", result.union_by_name);
	deserializer.ReadPropertyWithDefault<bool>(104, "hive_types_autocast", result.hive_types_autocast);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<LogicalType>>(105, "hive_types_schema", result.hive_types_schema);
	deserializer.ReadPropertyWithExplicitDefault<string>(106, "filename_column", result.filename_column, MultiFileOptions::DEFAULT_FILENAME_COLUMN);
	return result;
}